

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::ToAPISchemas
          (expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Token> *arg,bool ignore_unknown,
          string *warn)

{
  bool bVar1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar2;
  size_type sVar3;
  value_type *pvVar4;
  ParseState *value;
  ParseState *value_00;
  ParseState *value_01;
  ParseState *value_02;
  ParseState *value_03;
  ParseState *value_04;
  unexpected_type<const_char_*> local_6a0;
  unexpected_type<const_char_*> local_698;
  unexpected_type<const_char_*> local_690;
  expected_lite local_688 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_668;
  string local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [32];
  value_type local_608;
  allocator local_5d9;
  ParseState local_5d8;
  string instanceName_5;
  optional<tinyusdz::APISchemas::APIName> local_5b0;
  optional<tinyusdz::APISchemas::APIName> pv_5;
  Token *item_5;
  const_iterator __end8;
  const_iterator __begin8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range8;
  expected_lite local_580 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  string local_540 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520 [32];
  value_type local_500;
  allocator local_4d1;
  ParseState local_4d0;
  string instanceName_4;
  optional<tinyusdz::APISchemas::APIName> local_4a8;
  optional<tinyusdz::APISchemas::APIName> pv_4;
  Token *item_4;
  const_iterator __end7;
  const_iterator __begin7;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range7;
  expected_lite local_478 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  string local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  value_type local_3f8;
  allocator local_3c9;
  ParseState local_3c8;
  string instanceName_3;
  optional<tinyusdz::APISchemas::APIName> local_3a0;
  optional<tinyusdz::APISchemas::APIName> pv_3;
  Token *item_3;
  const_iterator __end6;
  const_iterator __begin6;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range6;
  expected_lite local_370 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  string local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [32];
  value_type local_2f0;
  allocator local_2c1;
  ParseState local_2c0;
  string instanceName_2;
  optional<tinyusdz::APISchemas::APIName> local_298;
  optional<tinyusdz::APISchemas::APIName> pv_2;
  Token *item_2;
  const_iterator __end5;
  const_iterator __begin5;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range5;
  expected_lite local_268 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  value_type local_1e8;
  allocator local_1b9;
  ParseState local_1b8;
  string instanceName_1;
  optional<tinyusdz::APISchemas::APIName> local_190;
  optional<tinyusdz::APISchemas::APIName> pv_1;
  Token *item_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range4;
  int local_15c;
  expected_lite local_158 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  value_type local_d8;
  allocator local_a9;
  ParseState local_a8;
  string instanceName;
  optional<tinyusdz::APISchemas::APIName> local_80;
  optional<tinyusdz::APISchemas::APIName> pv;
  Token *item;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range3;
  undefined1 local_50 [7];
  anon_class_1_0_00000001 SchemaHandler;
  APISchemas schemas;
  string *warn_local;
  bool ignore_unknown_local;
  ListOp<tinyusdz::Token> *arg_local;
  Impl *this_local;
  
  schemas.names.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)warn;
  APISchemas::APISchemas((APISchemas *)local_50);
  bVar1 = ListOp<tinyusdz::Token>::IsExplicit(arg);
  if (bVar1) {
    pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
    __end3._M_current =
         (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
    item = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                       *)&item), bVar1) {
      pv = (optional<tinyusdz::APISchemas::APIName>)
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
           ::operator*(&__end3);
      ToAPISchemas::anon_class_1_0_00000001::operator()
                ((optional<tinyusdz::APISchemas::APIName> *)((long)&instanceName.field_2 + 8),
                 (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv);
      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
      optional<tinyusdz::APISchemas::APIName,_0>
                (&local_80,
                 (optional<tinyusdz::APISchemas::APIName> *)((long)&instanceName.field_2 + 8));
      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                ((optional<tinyusdz::APISchemas::APIName> *)((long)&instanceName.field_2 + 8));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_80);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value(&local_80);
        ::std::
        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,pvVar4,&local_a8);
        ::std::
        vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&schemas,&local_d8);
        ::std::
        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_a8);
LAB_001c4d95:
        local_15c = 0;
      }
      else {
        if (ignore_unknown) {
          Token::str_abi_cxx11_((Token *)pv);
          ::std::operator+((char *)local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Ignored unknown or unsupported API schema: ");
          ::std::operator+(local_f8,(char *)local_118);
          ::std::__cxx11::string::operator+=
                    ((string *)
                     schemas.names.
                     super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f8);
          ::std::__cxx11::string::~string((string *)local_f8);
          ::std::__cxx11::string::~string(local_118);
          goto LAB_001c4d95;
        }
        Token::str_abi_cxx11_((Token *)pv);
        ::std::operator+((char *)local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Invalid or Unsupported API schema: ");
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>(&local_138,local_158,value);
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,&local_138);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type(&local_138);
        ::std::__cxx11::string::~string((string *)local_158);
        local_15c = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional(&local_80);
      if (local_15c != 0) goto LAB_001c5ed8;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
      ::operator++(&__end3);
    }
    local_50._0_4_ = ResetToExplicit;
LAB_001c5ebe:
    nonstd::expected_lite::
    expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<tinyusdz::APISchemas,_0>(__return_storage_ptr__,(APISchemas *)local_50);
    local_15c = 1;
  }
  else {
    pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
    sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
    if (sVar3 == 0) {
      pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
      sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
      if (sVar3 == 0) {
        pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
        sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
        if (sVar3 == 0) {
          pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
          sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
          if (sVar3 == 0) {
            pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
              sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2
                                );
              if (sVar3 == 0) {
                local_6a0 = nonstd::expected_lite::make_unexpected<char_const(&)[35]>
                                      ((char (*) [35])"Internal error: ListOp conversion.");
                nonstd::expected_lite::
                expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::expected<const_char_*,_0>(__return_storage_ptr__,&local_6a0);
                local_15c = 1;
              }
              else {
                pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
                sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   pvVar2);
                if (sVar3 == 0) {
                  pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
                  sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     pvVar2);
                  if (sVar3 == 0) {
                    pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
                    sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                       pvVar2);
                    if (sVar3 == 0) {
                      pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
                      sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)pvVar2);
                      if (sVar3 == 0) {
                        pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
                        sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                            *)pvVar2);
                        if (sVar3 == 0) {
                          local_698 = nonstd::expected_lite::make_unexpected<char_const(&)[28]>
                                                ((char (*) [28])"TODO: Ordered ListOp items.");
                          nonstd::expected_lite::
                          expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::expected<const_char_*,_0>(__return_storage_ptr__,&local_698);
                          local_15c = 1;
                          goto LAB_001c5ed8;
                        }
                      }
                    }
                  }
                }
                local_690 = nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                                      ((char (*) [79])
                                       "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                                      );
                nonstd::expected_lite::
                expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::expected<const_char_*,_0>(__return_storage_ptr__,&local_690);
                local_15c = 1;
              }
              goto LAB_001c5ed8;
            }
            pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
              sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2
                                );
              if (sVar3 == 0) {
                pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
                sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   pvVar2);
                if (sVar3 == 0) {
                  pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
                  sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     pvVar2);
                  if (sVar3 == 0) {
                    pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
                    sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                       pvVar2);
                    if (sVar3 == 0) {
                      pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
                      __end8._M_current =
                           (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                    begin((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           *)pvVar2);
                      item_5 = (Token *)std::
                                        vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                        end((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             *)pvVar2);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end8,(
                                                  __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)&item_5), bVar1) {
                        pv_5 = (optional<tinyusdz::APISchemas::APIName>)
                               __gnu_cxx::
                               __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                               ::operator*(&__end8);
                        ToAPISchemas::anon_class_1_0_00000001::operator()
                                  ((optional<tinyusdz::APISchemas::APIName> *)
                                   ((long)&instanceName_5.field_2 + 8),
                                   (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv_5);
                        nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                        optional<tinyusdz::APISchemas::APIName,_0>
                                  (&local_5b0,
                                   (optional<tinyusdz::APISchemas::APIName> *)
                                   ((long)&instanceName_5.field_2 + 8));
                        nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                                  ((optional<tinyusdz::APISchemas::APIName> *)
                                   ((long)&instanceName_5.field_2 + 8));
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)&local_5b0);
                        if (bVar1) {
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string((string *)&local_5d8,"",&local_5d9);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
                          pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                                   value(&local_5b0);
                          ::std::
                          pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                    ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_608,pvVar4,&local_5d8);
                          ::std::
                          vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&schemas,&local_608);
                          ::std::
                          pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_608);
                          ::std::__cxx11::string::~string((string *)&local_5d8);
LAB_001c5d48:
                          local_15c = 0;
                        }
                        else {
                          if (ignore_unknown) {
                            Token::str_abi_cxx11_((Token *)pv_5);
                            ::std::operator+((char *)local_648,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)"Ignored unknown or unsupported API schema: ");
                            ::std::operator+(local_628,(char *)local_648);
                            ::std::__cxx11::string::operator+=
                                      ((string *)
                                       schemas.names.
                                       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (string *)local_628);
                            ::std::__cxx11::string::~string((string *)local_628);
                            ::std::__cxx11::string::~string(local_648);
                            goto LAB_001c5d48;
                          }
                          Token::str_abi_cxx11_((Token *)pv_5);
                          ::std::operator+((char *)local_688,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)"Invalid or Unsupported API schema: ");
                          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                    (&local_668,local_688,value_04);
                          nonstd::expected_lite::
                          expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    (__return_storage_ptr__,&local_668);
                          nonstd::expected_lite::
                          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~unexpected_type(&local_668);
                          ::std::__cxx11::string::~string((string *)local_688);
                          local_15c = 1;
                        }
                        nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                                  (&local_5b0);
                        if (local_15c != 0) goto LAB_001c5ed8;
                        __gnu_cxx::
                        __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                        ::operator++(&__end8);
                      }
                      local_50._0_4_ = Prepend;
                      goto LAB_001c5ebe;
                    }
                  }
                }
              }
            }
            __range8 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                       nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                                 ((char (*) [79])
                                  "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                                 );
            nonstd::expected_lite::
            expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>
                      (__return_storage_ptr__,(unexpected_type<const_char_*> *)&__range8);
            local_15c = 1;
            goto LAB_001c5ed8;
          }
          pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
          sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
          if (sVar3 == 0) {
            pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
              sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2
                                );
              if (sVar3 == 0) {
                pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
                sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   pvVar2);
                if (sVar3 == 0) {
                  pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
                  sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     pvVar2);
                  if (sVar3 == 0) {
                    pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
                    __end7._M_current =
                         (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                  begin((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *
                                        )pvVar2);
                    item_4 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                      ::end((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             *)pvVar2);
                    while (bVar1 = __gnu_cxx::operator!=
                                             (&__end7,(
                                                  __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)&item_4), bVar1) {
                      pv_4 = (optional<tinyusdz::APISchemas::APIName>)
                             __gnu_cxx::
                             __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                             ::operator*(&__end7);
                      ToAPISchemas::anon_class_1_0_00000001::operator()
                                ((optional<tinyusdz::APISchemas::APIName> *)
                                 ((long)&instanceName_4.field_2 + 8),
                                 (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv_4);
                      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                      optional<tinyusdz::APISchemas::APIName,_0>
                                (&local_4a8,
                                 (optional<tinyusdz::APISchemas::APIName> *)
                                 ((long)&instanceName_4.field_2 + 8));
                      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                                ((optional<tinyusdz::APISchemas::APIName> *)
                                 ((long)&instanceName_4.field_2 + 8));
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)&local_4a8);
                      if (bVar1) {
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string((string *)&local_4d0,"",&local_4d1);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
                        pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                                 value(&local_4a8);
                        ::std::
                        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                  ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_500,pvVar4,&local_4d0);
                        ::std::
                        vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&schemas,&local_500);
                        ::std::
                        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_500);
                        ::std::__cxx11::string::~string((string *)&local_4d0);
LAB_001c5a23:
                        local_15c = 0;
                      }
                      else {
                        if (ignore_unknown) {
                          Token::str_abi_cxx11_((Token *)pv_4);
                          ::std::operator+((char *)local_540,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)"Ignored unknown or unsupported API schema: ");
                          ::std::operator+(local_520,(char *)local_540);
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     schemas.names.
                                     super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (string *)local_520);
                          ::std::__cxx11::string::~string((string *)local_520);
                          ::std::__cxx11::string::~string(local_540);
                          goto LAB_001c5a23;
                        }
                        Token::str_abi_cxx11_((Token *)pv_4);
                        ::std::operator+((char *)local_580,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"Invalid or Unsupported API schema: ");
                        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                  (&local_560,local_580,value_03);
                        nonstd::expected_lite::
                        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  (__return_storage_ptr__,&local_560);
                        nonstd::expected_lite::
                        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~unexpected_type(&local_560);
                        ::std::__cxx11::string::~string((string *)local_580);
                        local_15c = 1;
                      }
                      nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                                (&local_4a8);
                      if (local_15c != 0) goto LAB_001c5ed8;
                      __gnu_cxx::
                      __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                      ::operator++(&__end7);
                    }
                    local_50._0_4_ = Delete;
                    goto LAB_001c5ebe;
                  }
                }
              }
            }
          }
          __range7 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                               ((char (*) [79])
                                "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                               );
          nonstd::expected_lite::
          expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    (__return_storage_ptr__,(unexpected_type<const_char_*> *)&__range7);
          local_15c = 1;
          goto LAB_001c5ed8;
        }
        pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
        sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
        if (sVar3 == 0) {
          pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
          sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
          if (sVar3 == 0) {
            pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
              sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2
                                );
              if (sVar3 == 0) {
                pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
                sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   pvVar2);
                if (sVar3 == 0) {
                  pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
                  __end6._M_current =
                       (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                begin((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      pvVar2);
                  item_3 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                    end((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *
                                        )pvVar2);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end6,(
                                                  __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)&item_3), bVar1) {
                    pv_3 = (optional<tinyusdz::APISchemas::APIName>)
                           __gnu_cxx::
                           __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                           ::operator*(&__end6);
                    ToAPISchemas::anon_class_1_0_00000001::operator()
                              ((optional<tinyusdz::APISchemas::APIName> *)
                               ((long)&instanceName_3.field_2 + 8),
                               (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv_3);
                    nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                    optional<tinyusdz::APISchemas::APIName,_0>
                              (&local_3a0,
                               (optional<tinyusdz::APISchemas::APIName> *)
                               ((long)&instanceName_3.field_2 + 8));
                    nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                              ((optional<tinyusdz::APISchemas::APIName> *)
                               ((long)&instanceName_3.field_2 + 8));
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)&local_3a0);
                    if (bVar1) {
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string((string *)&local_3c8,"",&local_3c9);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
                      pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                                         (&local_3a0);
                      ::std::
                      pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_3f8,pvVar4,&local_3c8);
                      ::std::
                      vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&schemas,&local_3f8);
                      ::std::
                      pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_3f8);
                      ::std::__cxx11::string::~string((string *)&local_3c8);
LAB_001c56fe:
                      local_15c = 0;
                    }
                    else {
                      if (ignore_unknown) {
                        Token::str_abi_cxx11_((Token *)pv_3);
                        ::std::operator+((char *)local_438,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"Ignored unknown or unsupported API schema: ");
                        ::std::operator+(local_418,(char *)local_438);
                        ::std::__cxx11::string::operator+=
                                  ((string *)
                                   schemas.names.
                                   super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (string *)local_418);
                        ::std::__cxx11::string::~string((string *)local_418);
                        ::std::__cxx11::string::~string(local_438);
                        goto LAB_001c56fe;
                      }
                      Token::str_abi_cxx11_((Token *)pv_3);
                      ::std::operator+((char *)local_478,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"Invalid or Unsupported API schema: ");
                      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                (&local_458,local_478,value_02);
                      nonstd::expected_lite::
                      expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (__return_storage_ptr__,&local_458);
                      nonstd::expected_lite::
                      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~unexpected_type(&local_458);
                      ::std::__cxx11::string::~string((string *)local_478);
                      local_15c = 1;
                    }
                    nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                              (&local_3a0);
                    if (local_15c != 0) goto LAB_001c5ed8;
                    __gnu_cxx::
                    __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    ::operator++(&__end6);
                  }
                  local_50._0_4_ = Append;
                  goto LAB_001c5ebe;
                }
              }
            }
          }
        }
        __range6 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                             ((char (*) [79])
                              "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                             );
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  (__return_storage_ptr__,(unexpected_type<const_char_*> *)&__range6);
        local_15c = 1;
        goto LAB_001c5ed8;
      }
      pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
      sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
      if (sVar3 == 0) {
        pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
        sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
        if (sVar3 == 0) {
          pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
          sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
          if (sVar3 == 0) {
            pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
              sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2
                                );
              if (sVar3 == 0) {
                pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
                __end5._M_current =
                     (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)pvVar2);
                item_2 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                  end((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      pvVar2);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end5,(
                                                  __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)&item_2), bVar1) {
                  pv_2 = (optional<tinyusdz::APISchemas::APIName>)
                         __gnu_cxx::
                         __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                         ::operator*(&__end5);
                  ToAPISchemas::anon_class_1_0_00000001::operator()
                            ((optional<tinyusdz::APISchemas::APIName> *)
                             ((long)&instanceName_2.field_2 + 8),
                             (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv_2);
                  nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                  optional<tinyusdz::APISchemas::APIName,_0>
                            (&local_298,
                             (optional<tinyusdz::APISchemas::APIName> *)
                             ((long)&instanceName_2.field_2 + 8));
                  nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                            ((optional<tinyusdz::APISchemas::APIName> *)
                             ((long)&instanceName_2.field_2 + 8));
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)&local_298);
                  if (bVar1) {
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string((string *)&local_2c0,"",&local_2c1);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                    pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                                       (&local_298);
                    ::std::
                    pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                              ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_2f0,pvVar4,&local_2c0);
                    ::std::
                    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&schemas,&local_2f0);
                    ::std::
                    pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_2f0);
                    ::std::__cxx11::string::~string((string *)&local_2c0);
LAB_001c53d9:
                    local_15c = 0;
                  }
                  else {
                    if (ignore_unknown) {
                      Token::str_abi_cxx11_((Token *)pv_2);
                      ::std::operator+((char *)local_330,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"Ignored unknown or unsupported API schema: ");
                      ::std::operator+(local_310,(char *)local_330);
                      ::std::__cxx11::string::operator+=
                                ((string *)
                                 schemas.names.
                                 super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)local_310);
                      ::std::__cxx11::string::~string((string *)local_310);
                      ::std::__cxx11::string::~string(local_330);
                      goto LAB_001c53d9;
                    }
                    Token::str_abi_cxx11_((Token *)pv_2);
                    ::std::operator+((char *)local_370,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)"Invalid or Unsupported API schema: ");
                    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                              (&local_350,local_370,value_01);
                    nonstd::expected_lite::
                    expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (__return_storage_ptr__,&local_350);
                    nonstd::expected_lite::
                    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~unexpected_type(&local_350);
                    ::std::__cxx11::string::~string((string *)local_370);
                    local_15c = 1;
                  }
                  nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                            (&local_298);
                  if (local_15c != 0) goto LAB_001c5ed8;
                  __gnu_cxx::
                  __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                  ::operator++(&__end5);
                }
                local_50._0_4_ = Add;
                goto LAB_001c5ebe;
              }
            }
          }
        }
      }
      __range5 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                           ((char (*) [79])
                            "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                           );
      nonstd::expected_lite::
      expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&__range5)
      ;
      local_15c = 1;
      goto LAB_001c5ed8;
    }
    pvVar2 = ListOp<tinyusdz::Token>::GetAddedItems(arg);
    sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
    if (sVar3 == 0) {
      pvVar2 = ListOp<tinyusdz::Token>::GetAppendedItems(arg);
      sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
      if (sVar3 == 0) {
        pvVar2 = ListOp<tinyusdz::Token>::GetDeletedItems(arg);
        sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
        if (sVar3 == 0) {
          pvVar2 = ListOp<tinyusdz::Token>::GetPrependedItems(arg);
          sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
          if (sVar3 == 0) {
            pvVar2 = ListOp<tinyusdz::Token>::GetOrderedItems(arg);
            sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar2);
            if (sVar3 == 0) {
              pvVar2 = ListOp<tinyusdz::Token>::GetExplicitItems(arg);
              __end4._M_current =
                   (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                       pvVar2);
              item_1 = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                            *)pvVar2);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                 *)&item_1), bVar1) {
                pv_1 = (optional<tinyusdz::APISchemas::APIName>)
                       __gnu_cxx::
                       __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                       ::operator*(&__end4);
                ToAPISchemas::anon_class_1_0_00000001::operator()
                          ((optional<tinyusdz::APISchemas::APIName> *)
                           ((long)&instanceName_1.field_2 + 8),
                           (anon_class_1_0_00000001 *)((long)&__range3 + 7),(token *)pv_1);
                nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::
                optional<tinyusdz::APISchemas::APIName,_0>
                          (&local_190,
                           (optional<tinyusdz::APISchemas::APIName> *)
                           ((long)&instanceName_1.field_2 + 8));
                nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                          ((optional<tinyusdz::APISchemas::APIName> *)
                           ((long)&instanceName_1.field_2 + 8));
                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&local_190);
                if (bVar1) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)&local_1b8,"",&local_1b9);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
                  pvVar4 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                                     (&local_190);
                  ::std::
                  pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                            ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1e8,pvVar4,&local_1b8);
                  ::std::
                  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&schemas,&local_1e8);
                  ::std::
                  pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_1e8);
                  ::std::__cxx11::string::~string((string *)&local_1b8);
LAB_001c50b4:
                  local_15c = 0;
                }
                else {
                  if (ignore_unknown) {
                    Token::str_abi_cxx11_((Token *)pv_1);
                    ::std::operator+((char *)local_228,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)"Ignored unknown or unsupported API schema: ");
                    ::std::operator+(local_208,(char *)local_228);
                    ::std::__cxx11::string::operator+=
                              ((string *)
                               schemas.names.
                               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)local_208);
                    ::std::__cxx11::string::~string((string *)local_208);
                    ::std::__cxx11::string::~string(local_228);
                    goto LAB_001c50b4;
                  }
                  Token::str_abi_cxx11_((Token *)pv_1);
                  ::std::operator+((char *)local_268,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Invalid or Unsupported API schema: ");
                  nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                            (&local_248,local_268,value_00);
                  nonstd::expected_lite::
                  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (__return_storage_ptr__,&local_248);
                  nonstd::expected_lite::
                  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~unexpected_type(&local_248);
                  ::std::__cxx11::string::~string((string *)local_268);
                  local_15c = 1;
                }
                nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::~optional
                          (&local_190);
                if (local_15c != 0) goto LAB_001c5ed8;
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                ::operator++(&__end4);
              }
              local_50._0_4_ = ResetToExplicit;
              goto LAB_001c5ebe;
            }
          }
        }
      }
    }
    __range4 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               nonstd::expected_lite::make_unexpected<char_const(&)[79]>
                         ((char (*) [79])
                          "Currently TinyUSDZ does not support ListOp with different ListEdit qualifiers."
                         );
    nonstd::expected_lite::
    expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&__range4);
    local_15c = 1;
  }
LAB_001c5ed8:
  APISchemas::~APISchemas((APISchemas *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<APISchemas, std::string> USDCReader::Impl::ToAPISchemas(
    const ListOp<value::token> &arg, bool ignore_unknown, std::string &warn) {
  APISchemas schemas;

  auto SchemaHandler =
      [](const value::token &tok) -> nonstd::optional<APISchemas::APIName> {
    if (tok.str() == "MaterialBindingAPI") {
      return APISchemas::APIName::MaterialBindingAPI;
    } else if (tok.str() == "NodeDefAPI") {
      return APISchemas::APIName::NodeDefAPI;
    } else if (tok.str() == "CoordSysAPI") {
      return APISchemas::APIName::CoordSysAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "CollectionAPI") {
      return APISchemas::APIName::CollectionAPI;
    } else if (tok.str() == "SkelBindingAPI") {
      return APISchemas::APIName::SkelBindingAPI;
    } else if (tok.str() == "VisibilityAPI") {
      return APISchemas::APIName::VisibilityAPI;
    } else if (tok.str() == "GeomModelAPI") {
      return APISchemas::APIName::GeomModelAPI;
    } else if (tok.str() == "MotionAPI") {
      return APISchemas::APIName::MotionAPI;
    } else if (tok.str() == "PrimvarsAPI") {
      return APISchemas::APIName::PrimvarsAPI;
    } else if (tok.str() == "XformCommonAPI") {
      return APISchemas::APIName::XformCommonAPI;
    } else if (tok.str() == "ListAPI") {
      return APISchemas::APIName::ListAPI;
    } else if (tok.str() == "LightListAPI") {
      return APISchemas::APIName::LightListAPI;
    } else if (tok.str() == "LightAPI") {
      return APISchemas::APIName::LightAPI;
    } else if (tok.str() == "MeshLightAPI") {
      return APISchemas::APIName::MeshLightAPI;
    } else if (tok.str() == "VolumeLightAPI") {
      return APISchemas::APIName::VolumeLightAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "ShadowAPI") {
      return APISchemas::APIName::ShadowAPI;
    } else if (tok.str() == "ShapingAPI") {
      return APISchemas::APIName::ShapingAPI;
    } else if (tok.str() == "Preliminary_AnchoringAPI") {
      return APISchemas::APIName::Preliminary_AnchoringAPI;
    } else if (tok.str() == "Preliminary_PhysicsColliderAPI") {
      return APISchemas::APIName::Preliminary_PhysicsColliderAPI;
    } else if (tok.str() == "Preliminary_PhysicsMaterialAPI") {
      return APISchemas::APIName::Preliminary_PhysicsMaterialAPI;
    } else if (tok.str() == "Preliminary_PhysicsRigidBodyAPI") {
      return APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI;
    } else {
      return nonstd::nullopt;
    }
  };

  if (arg.IsExplicit()) {  // fast path
    for (auto &item : arg.GetExplicitItems()) {
      if (auto pv = SchemaHandler(item)) {
        std::string instanceName = "";  // TODO
        schemas.names.push_back({pv.value(), instanceName});
      } else if (ignore_unknown) {
        warn += "Ignored unknown or unsupported API schema: " +
                                       item.str() + "\n";
      } else {
        return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                       item.str());
      }
    }
    schemas.listOpQual = ListEditQual::ResetToExplicit;

  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      if (arg.GetAddedItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetExplicitItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::ResetToExplicit;

    } else if (arg.GetAddedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &item : arg.GetAddedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Add;
    } else if (arg.GetAppendedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetAppendedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Append;
    } else if (arg.GetDeletedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetDeletedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Delete;
    } else if (arg.GetPrependedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetPrependedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Prepend;
    } else if (arg.GetOrderedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetPrependedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }

      // schemas.qual = ListEditQual::Order;
      return nonstd::make_unexpected("TODO: Ordered ListOp items.");
    } else {
      // ??? This should not happend.
      return nonstd::make_unexpected("Internal error: ListOp conversion.");
    }
  }

  return std::move(schemas);
}